

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall
gl4cts::IndirectDispatchBufferStorageTestCase::deinitTestCaseGlobal
          (IndirectDispatchBufferStorageTestCase *this)

{
  IndirectDispatchBufferStorageTestCase *this_local;
  
  if (this->m_helper_bo != 0) {
    (*this->m_gl->deleteBuffers)(1,&this->m_helper_bo);
    this->m_helper_bo = 0;
  }
  if (this->m_po != 0) {
    (*this->m_gl->deleteProgram)(this->m_po);
    this->m_po = 0;
  }
  return;
}

Assistant:

void IndirectDispatchBufferStorageTestCase::deinitTestCaseGlobal()
{
	if (m_helper_bo != 0)
	{
		m_gl.deleteBuffers(1, &m_helper_bo);

		m_helper_bo = 0;
	}

	if (m_po != 0)
	{
		m_gl.deleteProgram(m_po);

		m_po = 0;
	}
}